

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int str_path_unsafe(char *str)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 0;
  do {
    cVar1 = *str;
    if ((cVar1 == '/') || (cVar1 == '\\')) {
      bVar3 = iVar2 == 2;
      iVar2 = 0;
      if (bVar3) {
        return -1;
      }
    }
    else {
      if (cVar1 == '\0') {
        return -(uint)(iVar2 == 2);
      }
      if ((-1 < iVar2) && (iVar2 = iVar2 + 1, cVar1 != '.')) {
        iVar2 = -1;
      }
    }
    str = str + 1;
  } while( true );
}

Assistant:

int str_path_unsafe(const char *str)
{
	// State machine. 0 means that we're at the beginning
	// of a new directory/filename, and a positive number represents the number of
	// dots ('.') we found. -1 means we encountered a different character
	// since the last path separator (or the beginning of the string).
	int parse_counter = 0;
	while(*str)
	{
		if(*str == '\\' || *str == '/')
		{
			// A path separator. Check how many dots we found since
			// the last path separator.
			//
			// Two dots => ".." contained in the path. Return an
			// error.
			if(parse_counter == 2)
				return -1;
			else
				parse_counter = 0;
		}
		else if(parse_counter >= 0)
		{
			// If we have not encountered a non-dot character since
			// the last path separator, count the dots.
			if(*str == '.')
				parse_counter++;
			else
				parse_counter = -1;
		}

		++str;
	}
	// If there's a ".." at the end, fail too.
	if(parse_counter == 2)
		return -1;
	return 0;
}